

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O2

Node * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::find_subtree_min_max
          (KDTree<phosg::Vector2<long>,_long> *this,Node *n,size_t target_dim,bool find_max)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  Node *pNVar4;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  pending;
  Node *local_88;
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  local_80;
  
  local_88 = n;
  ::std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_Deque_base(&local_80);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)&local_80,&local_88);
  while( true ) {
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ::std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base(&local_80);
      return n;
    }
    local_88 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)&local_80);
    lVar1 = (&(local_88->pt).field_0)[target_dim].x;
    lVar2 = (&(n->pt).field_0)[target_dim].x;
    sVar3 = local_88->dim;
    if (find_max) break;
    pNVar4 = local_88;
    if (lVar2 <= lVar1) {
      pNVar4 = n;
    }
LAB_00108825:
    n = pNVar4;
    if (local_88->before != (Node *)0x0) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&local_80,&local_88->before);
      sVar3 = local_88->dim;
    }
    if (sVar3 != target_dim || find_max) {
LAB_0010884e:
      if (local_88->after_or_equal != (Node *)0x0) {
        ::std::
        deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
        ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                  ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                    *)&local_80,&local_88->after_or_equal);
      }
    }
  }
  pNVar4 = local_88;
  if (lVar1 <= lVar2) {
    pNVar4 = n;
  }
  n = pNVar4;
  if (sVar3 != target_dim || !find_max) goto LAB_00108825;
  goto LAB_0010884e;
}

Assistant:

typename KDTree<CoordType, ValueType>::Node*
KDTree<CoordType, ValueType>::find_subtree_min_max(Node* n,
    size_t target_dim, bool find_max) {

  Node* ret = n;

  std::deque<Node*> pending;
  pending.emplace_back(n);
  while (!pending.empty()) {
    n = pending.front();
    pending.pop_front();

    // update the min/max if this point is more extreme
    if (find_max) {
      if (n->pt.at(target_dim) > ret->pt.at(target_dim)) {
        ret = n;
      }
    } else {
      if (n->pt.at(target_dim) < ret->pt.at(target_dim)) {
        ret = n;
      }
    }

    // add new points to pending if needed. if this point splits the space along
    // the dimension we care about, then we only need to look at one side;
    // otherwise we have to look at both
    if (((n->dim != target_dim) || !find_max) && n->before) {
      pending.emplace_back(n->before);
    }
    if (((n->dim != target_dim) || find_max) && n->after_or_equal) {
      pending.emplace_back(n->after_or_equal);
    }
  }

  return ret;
}